

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

TimeZone * __thiscall icu_63::Calendar::orphanTimeZone(Calendar *this)

{
  TimeZone *pTVar1;
  TimeZone *z;
  TimeZone *defaultZone;
  Calendar *this_local;
  
  pTVar1 = TimeZone::createDefault();
  if (pTVar1 == (TimeZone *)0x0) {
    this_local = (Calendar *)0x0;
  }
  else {
    this_local = (Calendar *)this->fZone;
    this->fZone = pTVar1;
  }
  return (TimeZone *)this_local;
}

Assistant:

TimeZone*
Calendar::orphanTimeZone()
{
    // we let go of the time zone; the new time zone is the system default time zone
    TimeZone *defaultZone = TimeZone::createDefault();
    if (defaultZone == NULL) {
        // No error handling available. Must keep fZone non-NULL, there are many unchecked uses.
        return NULL;
    }
    TimeZone *z = fZone;
    fZone = defaultZone;
    return z;
}